

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowMatcher::Match
          (RowMatcher *this,DataChunk *lhs,vector<duckdb::TupleDataVectorFormat,_true> *lhs_formats,
          SelectionVector *sel,idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,
          SelectionVector *no_match_sel,idx_t *no_match_count)

{
  match_function_t p_Var1;
  reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  idx_t col_idx;
  ulong __n;
  
  for (__n = 0; __n < (ulong)((long)(this->match_functions).
                                    super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                                    .
                                    super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->match_functions).
                                    super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                                    .
                                    super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar2 = vector<duckdb::MatchFunction,_true>::get<true>(&this->match_functions,__n);
    p_Var1 = pvVar2->function;
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&lhs->data,__n);
    pvVar4 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(lhs_formats,__n);
    count = (*p_Var1)(pvVar3,pvVar4,sel,count,rhs_layout,rhs_row_locations,__n,
                      &pvVar2->child_functions,no_match_sel,no_match_count);
  }
  return count;
}

Assistant:

idx_t RowMatcher::Match(DataChunk &lhs, const vector<TupleDataVectorFormat> &lhs_formats, SelectionVector &sel,
                        idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                        SelectionVector *no_match_sel, idx_t &no_match_count) {
	D_ASSERT(!match_functions.empty());
	for (idx_t col_idx = 0; col_idx < match_functions.size(); col_idx++) {
		const auto &match_function = match_functions[col_idx];
		count =
		    match_function.function(lhs.data[col_idx], lhs_formats[col_idx], sel, count, rhs_layout, rhs_row_locations,
		                            col_idx, match_function.child_functions, no_match_sel, no_match_count);
	}
	return count;
}